

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void prvTidyDetachAttribute(Node *node,AttVal *attr)

{
  AttVal *local_28;
  AttVal *prev;
  AttVal *av;
  AttVal *attr_local;
  Node *node_local;
  
  local_28 = (AttVal *)0x0;
  prev = node->attributes;
  while( true ) {
    if (prev == (AttVal *)0x0) {
      return;
    }
    if (prev == attr) break;
    local_28 = prev;
    prev = prev->next;
  }
  if (local_28 != (AttVal *)0x0) {
    local_28->next = attr->next;
    return;
  }
  node->attributes = attr->next;
  return;
}

Assistant:

void TY_(DetachAttribute)( Node *node, AttVal *attr )
{
    AttVal *av, *prev = NULL;

    for ( av = node->attributes; av; av = av->next )
    {
        if ( av == attr )
        {
            if ( prev )
                prev->next = attr->next;
            else
                node->attributes = attr->next;
            break;
        }
        prev = av;
    }
}